

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
str_writer<char>::operator()
          (str_writer<char> *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RSI;
  char *in_RDI;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_30;
  ostream_type *local_20;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffffe8;
  
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_30,in_RSI);
  internal::copy_str<char,char_const*,std::ostream_iterator<char,char,std::char_traits<char>>>
            (in_RDI,(char *)in_RSI,in_stack_ffffffffffffffe8);
  in_RSI->_M_stream = local_20;
  in_RSI->_M_string = (char *)in_stack_ffffffffffffffe8;
  return;
}

Assistant:

void operator()(It &&it) const {
      it = internal::copy_str<char_type>(s, s + size_, it);
    }